

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  QStyle *style_00;
  Style *this;
  int argc_local;
  QApplication a;
  QArrayDataPointer<char16_t> local_180;
  QArrayDataPointer<char16_t> local_168;
  QString style;
  QStringList keys;
  Settings settings;
  MainWindow w;
  
  argc_local = argc;
  qMetaTypeId<RegExp>();
  qMetaTypeId<RegExpPath>();
  qMetaTypeId<RegExpReplacement>();
  qMetaTypeId<SearchParams>();
  qMetaTypeId<ReplaceParams>();
  qMetaTypeId<SearchHits>();
  qMetaTypeId<CountFilesParams>();
  qMetaTypeId<GetListingParams>();
  qMetaTypeId<ReplacedParams>();
  qMetaTypeId<RenameParams>();
  qMetaTypeId<SearchNameHits>();
  QApplication::QApplication(&a,&argc_local,argv,0x60204);
  QString::QString((QString *)&settings,"mugi-grep");
  QCoreApplication::setApplicationName((QString *)&settings);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&settings);
  QString::QString((QString *)&settings,"1.6.0");
  QCoreApplication::setApplicationVersion((QString *)&settings);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&settings);
  Settings::Settings(&settings);
  QStyleFactory::keys();
  QString::QString((QString *)&w,"Fusion");
  style_00 = (QStyle *)QStyleFactory::create((QString *)&w);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&w);
  this = (Style *)operator_new(0x18);
  Style::Style(this,style_00);
  QApplication::setStyle((QStyle *)this);
  Settings::style(&style,&settings);
  bVar1 = QString::operator==(&style,"dark");
  if (bVar1) {
    StyleHelper::setDarkStyle();
  }
  else {
    StyleHelper::setLightStyle();
  }
  MainWindow::MainWindow(&w,&settings,(QWidget *)0x0);
  QWidget::show();
  QCoreApplication::applicationDirPath();
  QString::QString((QString *)&local_180,"debug");
  cVar2 = QString::endsWith((QString *)&local_168,(CaseSensitivity)&local_180);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_180);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
  if (cVar2 != '\0') {
    LineContext::testParseCpp();
    LineContext::testParsePy();
  }
  iVar3 = QApplication::exec();
  MainWindow::~MainWindow(&w);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&style.d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&keys.d);
  Settings::~Settings(&settings);
  QApplication::~QApplication(&a);
  return iVar3;
}

Assistant:

int main(int argc, char *argv[])
{
    //QTextCodec::setCodecForCStrings(QTextCodec::codecForName("UTF-8"));

    qRegisterMetaType<RegExp>();
    qRegisterMetaType<RegExpPath>();
    qRegisterMetaType<RegExpReplacement>();
    qRegisterMetaType<SearchParams>();
    qRegisterMetaType<ReplaceParams>();
    qRegisterMetaType<SearchHits>();
    qRegisterMetaType<CountFilesParams>();
    qRegisterMetaType<GetListingParams>();
    qRegisterMetaType<ReplacedParams>();
    qRegisterMetaType<RenameParams>();
    qRegisterMetaType<SearchNameHits>();

    QApplication a(argc, argv);
    a.setApplicationName(APP_NAME);
    a.setApplicationVersion(VERSION);

    Settings settings;

    QStringList keys = QStyleFactory::keys();

    QStyle* fusion = QStyleFactory::create("Fusion");
    Style* style_ = new Style(fusion);

    qApp->setStyle(style_);

    QString style = settings.style();
    if (style == "dark") {
        StyleHelper::setDarkStyle();
    } else {
        StyleHelper::setLightStyle();
    }

    //
    /*a.setStyle("Windows");
    QStringList keys = QStyleFactory::keys();
    qDebug() << keys[0];*/
    //RegExpPath::test();
    //RegExp::test();
    //SearchResultRenderer::testDoZebra();

    MainWindow w(&settings);
    w.show();

    if (a.applicationDirPath().endsWith("debug")) {
        LineContext::testParseCpp();
        LineContext::testParsePy();
    }

    //SearchCache::testTokenize();

    return a.exec();
}